

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O1

void __thiscall
choc::value::Type::addObjectMember(Type *this,string_view memberName,Type *memberType)

{
  uint32_t *puVar1;
  Content *pCVar2;
  MainType MVar3;
  uint uVar4;
  Object *pOVar5;
  size_t __n;
  Allocator *pAVar6;
  Object *pOVar7;
  Object *pOVar8;
  int iVar9;
  ulong uVar10;
  char *__dest;
  MemberNameAndType *m;
  MemberNameAndType *pMVar11;
  size_t __n_00;
  MemberNameAndType *pMVar12;
  size_type size;
  int iVar13;
  bool bVar14;
  
  __n_00 = memberName._M_len;
  if (this->mainType != object) {
    throwError("This type is not an object");
  }
  pOVar5 = (this->content).object;
  uVar10 = (ulong)(pOVar5->members).size;
  if (uVar10 != 0) {
    pMVar11 = (pOVar5->members).items;
    pMVar12 = pMVar11 + uVar10;
    iVar13 = 0;
    do {
      __n = (pMVar11->name)._M_len;
      if (__n == __n_00) {
        if (__n == 0) {
          bVar14 = true;
        }
        else {
          iVar9 = bcmp((pMVar11->name)._M_str,memberName._M_str,__n);
          bVar14 = iVar9 == 0;
        }
      }
      else {
        bVar14 = false;
      }
      if (bVar14) goto LAB_001c433e;
      iVar13 = iVar13 + 1;
      pMVar11 = pMVar11 + 1;
    } while (pMVar11 != pMVar12);
    iVar13 = -1;
LAB_001c433e:
    if (-1 < iVar13) {
      throwError("This object already contains a member with the given name");
    }
  }
  if (this->allocator == (Allocator *)0x0) {
    __dest = (char *)malloc(__n_00 + 1);
  }
  else {
    __dest = (char *)(**(code **)(*(long *)this->allocator + 0x10))();
  }
  memcpy(__dest,memberName._M_str,__n_00);
  __dest[__n_00] = '\0';
  MVar3 = memberType->mainType;
  pOVar7 = (memberType->content).object;
  pOVar8 = *(Object **)((long)&memberType->content + 8);
  pAVar6 = memberType->allocator;
  memberType->mainType = void_;
  AllocatedVector<choc::value::MemberNameAndType>::reserve
            (&pOVar5->members,(pOVar5->members).size + 1);
  pMVar11 = (pOVar5->members).items;
  uVar4 = (pOVar5->members).size;
  pMVar11[uVar4].name._M_len = __n_00;
  pMVar11[uVar4].name._M_str = __dest;
  pMVar11[uVar4].type.mainType = MVar3;
  pCVar2 = &pMVar11[uVar4].type.content;
  pCVar2->object = pOVar7;
  (&pCVar2->object)[1] = pOVar8;
  pMVar11[uVar4].type.allocator = pAVar6;
  puVar1 = &(pOVar5->members).size;
  *puVar1 = *puVar1 + 1;
  return;
}

Assistant:

inline void Type::addObjectMember (std::string_view memberName, Type memberType)
{
    check (getObjectMemberIndex (memberName) < 0, "This object already contains a member with the given name");
    content.object->members.push_back ({ allocateString (allocator, memberName), std::move (memberType) });
}